

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int dbg_print(int format,FILE *target,void *data,int len,int sep)

{
  undefined8 uVar1;
  char *pcVar2;
  uint uVar3;
  
  switch(format) {
  case 0:
    if (columnar == 0) {
      fputs((char *)data,(FILE *)target);
    }
    else {
      fprintf((FILE *)target,"%-*s",(ulong)(uint)len,data);
    }
    break;
  case 2:
    uVar1 = *data;
    if (columnar == 0) goto LAB_0010625d;
    pcVar2 = "%12ld";
    goto LAB_001062d3;
  case 3:
  case 4:
    uVar1 = *data;
LAB_0010625d:
    pcVar2 = "%ld";
LAB_001062d3:
    fprintf((FILE *)target,pcVar2,uVar1);
    break;
  case 5:
    uVar3 = *data;
    if ((int)uVar3 < 0) {
      fputc(0x2d,(FILE *)target);
      uVar3 = -uVar3;
    }
    if (columnar == 0) {
      pcVar2 = "%d.%02d";
    }
    else {
      pcVar2 = "%12d.%02d";
    }
    fprintf((FILE *)target,pcVar2,(ulong)uVar3 / 100,(ulong)(uVar3 % 100));
    break;
  case 6:
    if (columnar == 0) {
      fputc((int)*data,(FILE *)target);
    }
    else {
      fprintf((FILE *)target,"%c ");
    }
  }
  if ((sep != -1) && (columnar == 0)) {
    fputc(0x7c,(FILE *)target);
  }
  return 0;
}

Assistant:

int
dbg_print(int format, FILE *target, void *data, int len, int sep)
{
	int dollars,
		cents;

	switch(format)
	{
	case DT_STR:
		if (columnar)
			/* Note: Columnar output cannot be in CSV format, */
			/* so there's no sense in quoting the string.     */
			fprintf(target, "%-*s", len, (char *)data);
		else
#ifdef DOUBLE_QUOTE_OUTPUT_STRINGS
			fprintf(target, "\"%s\"", (char *)data);
#else
			fprintf(target, "%s", (char *)data);
#endif
		break;
#ifdef MVS
	case DT_VSTR:
		/* note: only used in MVS, assumes columnar output */
		fprintf(target, "%c%c%-*s", 
			(len >> 8) & 0xFF, len & 0xFF, len, (char *)data);
		break;
#endif /* MVS */
	case DT_INT:
		if (columnar)
			fprintf(target, "%12ld", *(long *)data);
		else
			fprintf(target, "%ld", *(long *)data);
		break;
	case DT_HUGE:
		fprintf(target, HUGE_FORMAT, *(DSS_HUGE *)data);
		break;
	case DT_KEY:
		fprintf(target, "%ld", *(long *)data);
		break;
	case DT_MONEY:
		cents = *(long *)data;
		if (cents < 0)
			{
			fprintf(target, "-");
			cents = -cents;
			}
		dollars = cents / 100;
		cents %= 100;
		if (columnar)
			fprintf(target, "%12d.%02d", dollars, cents);
		else
			fprintf(target, "%d.%02d", dollars, cents);
		break;
	case DT_CHR:
		if (columnar)
			fprintf(target, "%c ", *(char *)data);
		else
			fprintf(target, "%c", *(char *)data);
		break;
	}

#ifdef EOL_HANDLING
	if (sep)
#endif /* EOL_HANDLING */
	if (!columnar && (sep != -1))
		fprintf(target, "%c", SEPARATOR);
	
	return(0);
}